

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

Vector3D *
CGL::SceneObjects::moller_trumbore
          (Vector3D *__return_storage_ptr__,Vector3D *p0,Vector3D *p1,Vector3D *p2,Ray *r)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_68;
  undefined8 uStack_60;
  double local_58;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_48;
  
  auVar9 = *(undefined1 (*) [16])(p0->field_0).field_2.__vec;
  auVar4 = vsubpd_avx(*(undefined1 (*) [16])(p1->field_0).field_2.__vec,auVar9);
  dVar1 = (p0->field_0).field_0.z;
  dVar6 = (p1->field_0).field_0.z - dVar1;
  local_48.field_2.__vec =
       (__m128d)vsubpd_avx(*(undefined1 (*) [16])(p2->field_0).field_2.__vec,auVar9);
  local_48.field_0.z = (p2->field_0).field_0.z - dVar1;
  auVar5 = vsubpd_avx(*(undefined1 (*) [16])(r->o).field_0.field_2.__vec,auVar9);
  dVar1 = (r->o).field_0.field_0.z - dVar1;
  cross(&r->d,(Vector3D *)&local_48.field_0);
  auVar8._8_8_ = uStack_60;
  auVar8._0_8_ = local_68;
  auVar2 = vshufpd_avx(auVar5,auVar5,1);
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar2._0_8_ * dVar6 - dVar1 * auVar3._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1 * auVar4._0_8_ - auVar5._0_8_ * dVar6;
  auVar10 = vunpcklpd_avx(auVar9,auVar10);
  auVar9 = vdppd_avx(auVar10,(undefined1  [16])local_48.field_2.__vec,0x31);
  dVar7 = auVar5._0_8_ * auVar3._0_8_ - auVar4._0_8_ * auVar2._0_8_;
  auVar2 = vdppd_avx(auVar8,auVar5,0x31);
  (__return_storage_ptr__->field_0).field_0.x = dVar7 * local_48.field_0.z + auVar9._0_8_;
  (__return_storage_ptr__->field_0).field_0.y = dVar1 * local_58 + auVar2._0_8_;
  auVar9 = vdppd_avx(auVar10,*(undefined1 (*) [16])(r->d).field_0.field_2.__vec,0x31);
  auVar2 = vdppd_avx(auVar8,auVar4,0x31);
  (__return_storage_ptr__->field_0).field_0.z = dVar7 * (r->d).field_0.field_0.z + auVar9._0_8_;
  local_68 = dVar6 * local_58 + auVar2._0_8_;
  Vector3D::operator/=(__return_storage_ptr__,&local_68);
  return __return_storage_ptr__;
}

Assistant:

Vector3D moller_trumbore(const Vector3D &p0, const Vector3D &p1, const Vector3D &p2, const Ray &r) {
    Vector3D e1, e2, s, s1, s2;

    e1 = p1 - p0;
    e2 = p2 - p0;
    s = r.o - p0;

    s1 = cross(r.d, e2);
    s2 = cross(s, e1);

    Vector3D t_b1_b2 = Vector3D();
    t_b1_b2.x = dot(s2,  e2);
    t_b1_b2.y = dot(s1,   s);
    t_b1_b2.z = dot(s2, r.d);

    t_b1_b2 /= dot(s1, e1);

    return t_b1_b2;
}